

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempExpression.cpp
# Opt level: O0

void __thiscall IRT::TempExpression::TempExpression(TempExpression *this,Temporary *temporary)

{
  Temporary *temporary_local;
  TempExpression *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_BaseElement._vptr_BaseElement =
       (_func_int **)&PTR__TempExpression_001d9a68;
  Temporary::Temporary(&this->temporary_,temporary);
  return;
}

Assistant:

IRT::TempExpression::TempExpression(IRT::Temporary temporary)
    : temporary_(std::move(temporary)) {}